

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.h
# Opt level: O3

double __thiscall sdf::Box::signedDistance(Box *this,Vector3d *location)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (this->super_Primitive).parameters.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] *
          -0.5 + ABS((location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0]);
  dVar1 = (this->super_Primitive).parameters.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] *
          -0.5 + ABS((location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[1]);
  dVar2 = (this->super_Primitive).parameters.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] *
          -0.5 + ABS((location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[2]);
  dVar4 = 0.0;
  if (0.0 <= dVar3) {
    dVar4 = dVar3;
  }
  dVar5 = 0.0;
  if (0.0 <= dVar1) {
    dVar5 = dVar1;
  }
  dVar6 = 0.0;
  if (0.0 <= dVar2) {
    dVar6 = dVar2;
  }
  if (dVar2 <= dVar1) {
    dVar2 = dVar1;
  }
  if (dVar2 <= dVar3) {
    dVar2 = dVar3;
  }
  dVar1 = 0.0;
  if (dVar2 <= 0.0) {
    dVar1 = dVar2;
  }
  dVar1 = SQRT(dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5) + dVar1;
  if ((this->super_Primitive).invert != false) {
    dVar1 = -dVar1;
  }
  return dVar1;
}

Assistant:

double signedDistance(Eigen::Vector3d &location)
    { 
   
      Eigen::Vector3d dist;
      dist(0) = fabs(location(0)) - (parameters(0)/2);
      dist(1) = fabs(location(1)) - (parameters(1)/2);
      dist(2) = fabs(location(2)) - (parameters(2)/2);
      Eigen::Vector3d mdz( std::max(dist(0), 0.0),std::max(dist(1), 0.0),std::max(dist(2), 0.0));

      double value = std::min(  std::max(  dist(0), std::max(  dist(1), dist(2)  ) ), 0.0  )  + sqrt(mdz(0)*mdz(0) + mdz(1)*mdz(1) + mdz(2)*mdz(2)); 
      return (invert) ? -value : value;
    }